

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

class_book_conflict * object_kind_to_book(object_kind *kind)

{
  int local_24;
  player_class *ppStack_20;
  wchar_t i;
  player_class *class;
  object_kind *kind_local;
  
  ppStack_20 = classes;
  do {
    if (ppStack_20 == (player_class *)0x0) {
      return (class_book_conflict *)0x0;
    }
    for (local_24 = 0; local_24 < (ppStack_20->magic).num_books; local_24 = local_24 + 1) {
      if ((kind->tval == (ppStack_20->magic).books[local_24].tval) &&
         (kind->sval == (ppStack_20->magic).books[local_24].sval)) {
        return (ppStack_20->magic).books + local_24;
      }
    }
    ppStack_20 = ppStack_20->next;
  } while( true );
}

Assistant:

const struct class_book *object_kind_to_book(const struct object_kind *kind)
{
	struct player_class *class = classes;
	while (class) {
		int i;

		for (i = 0; i < class->magic.num_books; i++)
		if ((kind->tval == class->magic.books[i].tval) &&
			(kind->sval == class->magic.books[i].sval)) {
			return &class->magic.books[i];
		}
		class = class->next;
	}

	return NULL;
}